

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O3

int jsgf_write_fsg(jsgf_t *grammar,jsgf_rule_t *rule,FILE *outfh)

{
  logmath_t *lmath;
  fsg_model_t *fsg;
  int iVar1;
  
  iVar1 = 0;
  lmath = logmath_init(1.0001,0,0);
  fsg = jsgf_build_fsg_internal(grammar,rule,lmath,1.0,0);
  if (fsg == (fsg_model_t *)0x0) {
    iVar1 = -1;
  }
  else {
    fsg_model_write(fsg,outfh);
  }
  logmath_free(lmath);
  return iVar1;
}

Assistant:

int
jsgf_write_fsg(jsgf_t * grammar, jsgf_rule_t * rule, FILE * outfh)
{
    fsg_model_t *fsg;
    logmath_t *lmath = logmath_init(1.0001, 0, 0);

    if ((fsg = jsgf_build_fsg_raw(grammar, rule, lmath, 1.0)) == NULL)
        goto error_out;

    fsg_model_write(fsg, outfh);
    logmath_free(lmath);
    return 0;

  error_out:
    logmath_free(lmath);
    return -1;
}